

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

TValue * ffi_clib_index(lua_State *L)

{
  TValue *pTVar1;
  
  pTVar1 = L->base;
  if (((pTVar1 < L->top) && ((pTVar1->field_2).it == 0xfffffff3)) &&
     (*(char *)((ulong)(pTVar1->u32).lo + 6) == '\x02')) {
    if ((pTVar1 + 1 < L->top) && (*(int *)((long)pTVar1 + 0xc) == -5)) {
      pTVar1 = lj_clib_index(L,(CLibrary *)((ulong)(pTVar1->u32).lo + 0x18),
                             (GCstr *)(ulong)pTVar1[1].u32.lo);
      return pTVar1;
    }
    lj_err_argt(L,2,4);
  }
  lj_err_argt(L,1,7);
}

Assistant:

static TValue *ffi_clib_index(lua_State *L)
{
  TValue *o = L->base;
  CLibrary *cl;
  if (!(o < L->top && tvisudata(o) && udataV(o)->udtype == UDTYPE_FFI_CLIB))
    lj_err_argt(L, 1, LUA_TUSERDATA);
  cl = (CLibrary *)uddata(udataV(o));
  if (!(o+1 < L->top && tvisstr(o+1)))
    lj_err_argt(L, 2, LUA_TSTRING);
  return lj_clib_index(L, cl, strV(o+1));
}